

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.h
# Opt level: O1

void hexdump(char *desc,void *addr,size_t len,FILE *fp)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  uchar buf [17];
  char acStack_48 [24];
  
  if (desc != (char *)0x0) {
    fprintf((FILE *)fp,"%s:\n",desc);
  }
  if ((int)len == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if ((uVar3 & 0xf) == 0) {
        if (uVar3 != 0) {
          fprintf((FILE *)fp,"  |%s|\n",acStack_48);
        }
        fprintf((FILE *)fp,"%08x ",uVar3 & 0xffffffff);
      }
      else if ((uVar3 & 7) == 0) {
        fputc(0x20,(FILE *)fp);
      }
      fprintf((FILE *)fp," %02x",(ulong)*(byte *)((long)addr + uVar3));
      cVar1 = *(char *)((long)addr + uVar3);
      if ((byte)(*(char *)((long)addr + uVar3) + 0x81U) < 0xa1) {
        cVar1 = '.';
      }
      acStack_48[(uint)uVar3 & 0xf] = cVar1;
      acStack_48[(uVar3 & 0xf) + 1] = '\0';
      uVar3 = uVar3 + 1;
    } while ((len & 0xffffffff) != uVar3);
  }
  uVar2 = (uint)uVar3;
  if (0xfffffff7 < (uVar2 & 0xf) - 9) {
    fputc(0x20,(FILE *)fp);
  }
  if ((uVar3 & 0xf) != 0) {
    do {
      uVar2 = uVar2 + 1;
      fwrite("   ",3,1,(FILE *)fp);
    } while ((uVar2 & 0xf) != 0);
  }
  fprintf((FILE *)fp,"  |%s|\n",acStack_48);
  return;
}

Assistant:

static void hexdump(const char *desc, const void *addr, size_t len, FILE *fp) {
    unsigned int i;
    unsigned char buf[17];
    const unsigned char *pc = (const unsigned char*)addr;

    /* Output description if given. */
    if (desc != NULL) fprintf(fp, "%s:\n", desc);

    for (i = 0; i < (unsigned int)len; i++) {

        if ((i % 16) == 0) {
            if (i != 0) fprintf(fp, "  |%s|\n", buf);
            fprintf(fp, "%08x ", i);
        } else if ((i % 8) == 0) {
            fprintf(fp, " ");
        }
        fprintf(fp, " %02x", pc[i]);
        if ((pc[i] < 0x20) || (pc[i] > 0x7e)) {
            buf[i % 16] = '.';
        } else {
            buf[i % 16] = pc[i];
        }
        buf[(i % 16) + 1] = '\0';
    }
    if (i % 16 <= 8 && i % 16 != 0) fprintf(fp, " ");
    while ((i % 16) != 0) {
        fprintf(fp, "   ");
        i++;
    }
    fprintf(fp, "  |%s|\n", buf);
}